

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O0

int shake256_init(keccak_sponge *sponge)

{
  void *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = -1;
  }
  else {
    memset(in_RDI,0,200);
    *(undefined8 *)((long)in_RDI + 0xd8) = 0;
    *(undefined8 *)((long)in_RDI + 0xd0) = 0x53efb6b64647b401;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int shake256_init(keccak_sponge* const __restrict sponge) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  };
  memset(sponge->a, 0, 200);
  sponge->position = 0;
  sponge->flags = FLAG_ABSORBING;
  return 0;
}